

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mockingboard.hpp
# Opt level: O3

void __thiscall Apple::II::Mockingboard::Mockingboard(Mockingboard *this,AYPair *ays)

{
  MOS6522<Apple::II::Mockingboard::AYVIA> *pMVar1;
  
  (this->super_Card).delegate_ = (Delegate *)0x0;
  (this->super_Card)._vptr_Card = (_func_int **)&PTR__Card_005925d8;
  this->vias_[0].super_MOS6522Storage.is_phase2_ = false;
  this->vias_[0].super_MOS6522Storage.registers_.output[0] = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.output[1] = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.input[0] = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.input[1] = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.data_direction[0] = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.data_direction[1] = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.timer[0] = 0;
  *(undefined8 *)(this->vias_[0].super_MOS6522Storage.registers_.timer + 1) = 0;
  this->vias_[0].super_MOS6522Storage.registers_.last_timer[1] = 0;
  this->vias_[0].super_MOS6522Storage.registers_.next_timer[0] = -1;
  this->vias_[0].super_MOS6522Storage.registers_.next_timer[1] = -1;
  this->vias_[0].super_MOS6522Storage.registers_.shift = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.auxiliary_control = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.peripheral_control = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.interrupt_flags = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.interrupt_enable = '\0';
  this->vias_[0].super_MOS6522Storage.registers_.timer_needs_reload = false;
  this->vias_[0].super_MOS6522Storage.registers_.timer_port_b_output = 0xff;
  this->vias_[0].super_MOS6522Storage.control_inputs_[0] = (bool  [2])0x0;
  this->vias_[0].super_MOS6522Storage.control_inputs_[1] = (bool  [2])0x0;
  this->vias_[0].super_MOS6522Storage.control_outputs_[0].lines[0] = Input;
  *(undefined8 *)(this->vias_[0].super_MOS6522Storage.control_outputs_[0].lines + 1) = 0x200000002;
  this->vias_[0].super_MOS6522Storage.control_outputs_[1].lines[1] = Input;
  *(undefined4 *)((long)this->vias_[0].super_MOS6522Storage.handshake_modes_ + 7) = 0;
  this->vias_[0].super_MOS6522Storage.handshake_modes_[0] = None;
  this->vias_[0].super_MOS6522Storage.handshake_modes_[1] = None;
  this->vias_[0].super_MOS6522Storage.shift_bits_remaining_ = 8;
  this->vias_[0].bus_handler_ = this->handlers_;
  this->vias_[0].time_since_bus_handler_call_.super_WrappedInt<HalfCycles>.length_ = 0;
  this->vias_[1].super_MOS6522Storage.is_phase2_ = false;
  pMVar1 = this->vias_;
  pMVar1[1].super_MOS6522Storage.registers_.output[0] = '\0';
  pMVar1[1].super_MOS6522Storage.registers_.output[1] = '\0';
  pMVar1[1].super_MOS6522Storage.registers_.input[0] = '\0';
  pMVar1[1].super_MOS6522Storage.registers_.input[1] = '\0';
  pMVar1[1].super_MOS6522Storage.registers_.data_direction[0] = '\0';
  pMVar1[1].super_MOS6522Storage.registers_.data_direction[1] = '\0';
  pMVar1[1].super_MOS6522Storage.registers_.timer[0] = 0;
  *(undefined8 *)(this->vias_[1].super_MOS6522Storage.registers_.timer + 1) = 0;
  this->vias_[1].super_MOS6522Storage.registers_.last_timer[1] = 0;
  this->vias_[1].super_MOS6522Storage.registers_.next_timer[0] = -1;
  this->vias_[1].super_MOS6522Storage.registers_.next_timer[1] = -1;
  this->vias_[1].super_MOS6522Storage.registers_.interrupt_enable = '\0';
  this->vias_[1].super_MOS6522Storage.registers_.timer_needs_reload = false;
  pMVar1 = this->vias_;
  pMVar1[1].super_MOS6522Storage.registers_.shift = '\0';
  pMVar1[1].super_MOS6522Storage.registers_.auxiliary_control = '\0';
  pMVar1[1].super_MOS6522Storage.registers_.peripheral_control = '\0';
  pMVar1[1].super_MOS6522Storage.registers_.interrupt_flags = '\0';
  this->vias_[1].super_MOS6522Storage.registers_.timer_port_b_output = 0xff;
  this->vias_[1].super_MOS6522Storage.control_inputs_[0] = (bool  [2])0x0;
  this->vias_[1].super_MOS6522Storage.control_inputs_[1] = (bool  [2])0x0;
  this->vias_[1].super_MOS6522Storage.control_outputs_[0].lines[0] = Input;
  *(undefined8 *)(this->vias_[1].super_MOS6522Storage.control_outputs_[0].lines + 1) = 0x200000002;
  this->vias_[1].super_MOS6522Storage.control_outputs_[1].lines[1] = Input;
  this->vias_[1].super_MOS6522Storage.handshake_modes_[0] = None;
  this->vias_[1].super_MOS6522Storage.handshake_modes_[1] = None;
  *(undefined4 *)((long)this->vias_[1].super_MOS6522Storage.handshake_modes_ + 7) = 0;
  this->vias_[1].super_MOS6522Storage.shift_bits_remaining_ = 8;
  this->vias_[1].bus_handler_ = this->handlers_ + 1;
  this->vias_[1].time_since_bus_handler_call_.super_WrappedInt<HalfCycles>.length_ = 0;
  this->handlers_[0].card = this;
  this->handlers_[0].ay = (AY38910SampleSource<false> *)ays;
  this->handlers_[1].card = this;
  this->handlers_[1].ay = (AY38910SampleSource<false> *)&ays->field_0x1150;
  (this->super_Card).select_constraints_ = 0;
  return;
}

Assistant:

Mockingboard(AYPair &ays) :
			vias_{ {handlers_[0]}, {handlers_[1]} },
			handlers_{ {*this, ays.get(0)}, {*this, ays.get(1)}} {
			set_select_constraints(0);
		}